

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O1

idx_t duckdb::ValidityAppend
                (CompressionAppendState *append_state,ColumnSegment *segment,
                SegmentStatistics *stats,UnifiedVectorFormat *data,idx_t offset,idx_t vcount)

{
  atomic<unsigned_long> *paVar1;
  ulong *puVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  byte bVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar6 = ColumnSegment::SegmentSize(segment);
  uVar8 = (iVar6 & 0xffffffffffffff00) * 8 -
          (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  if (vcount < uVar8) {
    uVar8 = vcount;
  }
  if ((data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    LOCK();
    paVar1 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + uVar8;
    UNLOCK();
    (stats->statistics).has_no_null = true;
  }
  else {
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(append_state->handle).node);
    if (uVar8 != 0) {
      pdVar3 = ((append_state->handle).node.ptr)->buffer;
      iVar6 = 0;
      do {
        psVar4 = data->sel->sel_vector;
        if (psVar4 == (sel_t *)0x0) {
          uVar7 = offset + iVar6;
        }
        else {
          uVar7 = (ulong)psVar4[offset + iVar6];
        }
        if (((data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6]
             >> (uVar7 & 0x3f) & 1) == 0) {
          uVar7 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
                  super___atomic_base<unsigned_long>._M_i + iVar6;
          bVar5 = (byte)uVar7 & 0x3f;
          puVar2 = (ulong *)(pdVar3 + (uVar7 >> 6) * 8);
          *puVar2 = *puVar2 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
          (stats->statistics).has_null = true;
        }
        else {
          (stats->statistics).has_no_null = true;
        }
        iVar6 = iVar6 + 1;
      } while (uVar8 != iVar6);
    }
    LOCK();
    paVar1 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + uVar8;
    UNLOCK();
  }
  return uVar8;
}

Assistant:

idx_t ValidityAppend(CompressionAppendState &append_state, ColumnSegment &segment, SegmentStatistics &stats,
                     UnifiedVectorFormat &data, idx_t offset, idx_t vcount) {
	D_ASSERT(segment.GetBlockOffset() == 0);
	auto &validity_stats = stats.statistics;

	auto max_tuples = segment.SegmentSize() / ValidityMask::STANDARD_MASK_SIZE * STANDARD_VECTOR_SIZE;
	idx_t append_count = MinValue<idx_t>(vcount, max_tuples - segment.count);
	if (data.validity.AllValid()) {
		// no null values: skip append
		segment.count += append_count;
		validity_stats.SetHasNoNullFast();
		return append_count;
	}

	ValidityMask mask(reinterpret_cast<validity_t *>(append_state.handle.Ptr()), max_tuples);
	for (idx_t i = 0; i < append_count; i++) {
		auto idx = data.sel->get_index(offset + i);
		if (!data.validity.RowIsValidUnsafe(idx)) {
			mask.SetInvalidUnsafe(segment.count + i);
			validity_stats.SetHasNullFast();
		} else {
			validity_stats.SetHasNoNullFast();
		}
	}
	segment.count += append_count;
	return append_count;
}